

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O2

value * mjs::parse_value(value *__return_storage_ptr__,gc_heap *h,string *s)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  istream *piVar6;
  long lVar7;
  runtime_error *this;
  wostream *pwVar8;
  undefined1 *rhs;
  size_type sVar9;
  double dVar10;
  anon_class_16_2_de30df33 require_complete;
  wstring res;
  string type;
  wstring_view local_358 [2];
  string val;
  wstring_view local_1c0;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)s,_S_in);
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  require_complete.iss = &iss;
  require_complete.s = s;
  piVar6 = std::operator>>((istream *)&iss,(string *)&type);
  if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_00112e22;
  while (lVar7 = std::streambuf::in_avail(), lVar7 != 0) {
    iVar5 = std::istream::peek();
    iVar5 = isblank(iVar5);
    if (iVar5 == 0) break;
    std::istream::get();
  }
  bVar3 = std::operator==(&type,"undefined");
  if (bVar3) {
    parse_value::anon_class_16_2_de30df33::operator()(&require_complete);
    rhs = (undefined1 *)&value::undefined;
  }
  else {
    bVar3 = std::operator==(&type,"null");
    if (!bVar3) {
      bVar3 = std::operator==(&type,"boolean");
      if (!bVar3) {
LAB_00112aa9:
        bVar3 = std::operator==(&type,"number");
        if ((bVar3) && (lVar7 = std::streambuf::in_avail(), lVar7 != 0)) {
          iVar5 = std::istream::peek();
          iVar5 = isalpha(iVar5);
          if (iVar5 == 0) {
            piVar6 = std::istream::_M_extract<double>((double *)&iss);
            if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
              parse_value::anon_class_16_2_de30df33::operator()(&require_complete);
              __return_storage_ptr__->type_ = number;
              (__return_storage_ptr__->field_1).n_ = (double)val._M_dataplus._M_p;
              goto LAB_00112d20;
            }
          }
          else {
            val._M_string_length = 0;
            val.field_2._M_local_buf[0] = '\0';
            val._M_dataplus._M_p = (pointer)&val.field_2;
            piVar6 = std::operator>>((istream *)&iss,(string *)&val);
            if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
              parse_value::anon_class_16_2_de30df33::operator()(&require_complete);
              sVar2 = val._M_string_length;
              _Var1 = val._M_dataplus;
              for (sVar9 = 0; sVar2 != sVar9; sVar9 = sVar9 + 1) {
                iVar5 = tolower((int)_Var1._M_p[sVar9]);
                _Var1._M_p[sVar9] = (char)iVar5;
              }
              bVar3 = std::operator==(&val,"infinity");
              if (bVar3) {
                dVar10 = INFINITY;
              }
              else {
                bVar3 = std::operator==(&val,"nan");
                if (!bVar3) goto LAB_00112b27;
                dVar10 = NAN;
              }
              __return_storage_ptr__->type_ = number;
              (__return_storage_ptr__->field_1).n_ = dVar10;
              goto LAB_00112e09;
            }
LAB_00112b27:
            std::__cxx11::string::~string((string *)&val);
          }
        }
        bVar3 = std::operator==(&type,"string");
        if ((bVar3) && (iVar5 = std::istream::get(), iVar5 == 0x27)) {
          res._M_dataplus._M_p = (pointer)&res.field_2;
          res._M_string_length = 0;
          res.field_2._M_local_buf[0] = L'\0';
          bVar3 = false;
LAB_00112c2a:
          lVar7 = std::streambuf::in_avail();
          if (lVar7 != 0) {
            sVar4 = std::istream::get();
            if (!bVar3) goto LAB_00112c7a;
            switch(sVar4) {
            case 0x6e:
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
switchD_00112c94_caseD_6f:
              std::__cxx11::wostringstream::wostringstream((wostringstream *)&val);
              pwVar8 = std::operator<<((wostream *)&val,"Not implemented: ");
              pwVar8 = std::operator<<(pwVar8,"Unhandled escape sequence \\");
              std::operator<<(pwVar8,(char)sVar4);
              std::__cxx11::wstringbuf::str();
              local_1c0._M_len = (size_t)local_358[0]._M_str;
              local_1c0._M_str = (wchar_t *)local_358[0]._M_len;
              throw_runtime_error(&local_1c0,
                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                                  ,0x76);
            case 0x72:
              break;
            case 0x74:
              break;
            case 0x75:
              get_escape_sequence((istream *)&iss);
              break;
            case 0x76:
              break;
            default:
              if ((((sVar4 != 0x22) && (sVar4 != 0x27)) && (sVar4 != 0x5c)) &&
                 ((sVar4 != 0x62 && (sVar4 != 0x66)))) goto switchD_00112c94_caseD_6f;
            }
            goto LAB_00112cb2;
          }
          std::__cxx11::wstring::~wstring((wstring *)&res);
        }
LAB_00112e22:
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       "Invalid test spec value \"",s);
        std::operator+(&val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &res,"\"");
        std::runtime_error::runtime_error(this,(string *)&val);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      val._M_string_length = 0;
      val.field_2._M_local_buf[0] = '\0';
      val._M_dataplus._M_p = (pointer)&val.field_2;
      piVar6 = std::operator>>((istream *)&iss,(string *)&val);
      if ((((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) ||
         ((bVar3 = std::operator==(&val,"true"), !bVar3 &&
          (bVar3 = std::operator==(&val,"false"), !bVar3)))) {
        std::__cxx11::string::~string((string *)&val);
        goto LAB_00112aa9;
      }
      parse_value::anon_class_16_2_de30df33::operator()(&require_complete);
      bVar3 = std::operator==(&val,"true");
      __return_storage_ptr__->type_ = boolean;
      (__return_storage_ptr__->field_1).b_ = bVar3;
LAB_00112e09:
      std::__cxx11::string::~string((string *)&val);
      goto LAB_00112d20;
    }
    parse_value::anon_class_16_2_de30df33::operator()(&require_complete);
    rhs = value::null;
  }
  value::value(__return_storage_ptr__,(value *)rhs);
LAB_00112d20:
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return __return_storage_ptr__;
LAB_00112c7a:
  bVar3 = true;
  if (sVar4 != 0x5c) {
    if (sVar4 == 0x27) {
      parse_value::anon_class_16_2_de30df33::operator()(&require_complete);
      local_358[0]._M_len = res._M_string_length;
      local_358[0]._M_str = res._M_dataplus._M_p;
      string::string((string *)&val,h,local_358);
      value::value(__return_storage_ptr__,(string *)&val);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&val);
      std::__cxx11::wstring::~wstring((wstring *)&res);
      goto LAB_00112d20;
    }
LAB_00112cb2:
    bVar3 = false;
    std::__cxx11::wstring::push_back((wchar_t)&res);
  }
  goto LAB_00112c2a;
}

Assistant:

value parse_value(gc_heap& h, const std::string& s) {
    std::istringstream iss{s};
    std::string type;

    auto require_complete = [&]() {
        if (iss.rdbuf()->in_avail()) {
            throw std::runtime_error("Invalid test spec. Parse not complete in \"" + s + "\" Unparsed: \"" + s.substr(iss.tellg()) + "\"");
        }
    };

    if (iss >> type) {
        while (iss.rdbuf()->in_avail() && isblank(iss.peek()))
            iss.get();

        if (type == "undefined") {
            require_complete();
            return value::undefined;
        } else if (type == "null") {
            require_complete();
            return value::null;
        } else if (type == "boolean") {
            std::string val;
            if ((iss >> val) && (val == "true" || val == "false")) {
                require_complete();
                return mjs::value{val == "true"};
            }
        }
        if (type == "number" && iss.rdbuf()->in_avail()) {
            if (isalpha(iss.peek())) {
                std::string name;
                if (iss >> name) {
                    require_complete();
                    for (auto& c: name) c = static_cast<char>(tolower(c));
                    if (name == "infinity") return mjs::value{INFINITY};
                    if (name == "nan") return mjs::value{NAN};
                }
            } else {
                double val;
                if (iss >> val) {
                    require_complete();
                    return value{val};
                }
            }
        }
        if (type == "string" && iss.get() == '\'') {
            std::wstring res;
            bool escape = false;
            while (iss.rdbuf()->in_avail()) {
                const auto ch = static_cast<uint16_t>(iss.get());
                if (escape)  {
                    switch (ch) {
                    case 'b': res.push_back('\x08'); break;
                    case 't': res.push_back('\t'); break;
                    case 'n': res.push_back('\n'); break;
                    case 'v': res.push_back('\x0b'); break;
                    case 'f': res.push_back('\x0c'); break;
                    case 'r': res.push_back('\r'); break;
                    case 'u': res.push_back(get_escape_sequence(iss)); break;
                    case '\"': [[fallthrough]];
                    case '\'': [[fallthrough]];
                    case '\\': res.push_back(ch); break;
                    default:
                        NOT_IMPLEMENTED("Unhandled escape sequence \\" << (char)ch);
                    }
                    escape = false;
                } else if (ch == '\\') {
                    escape = true;
                } else if (ch == '\'') {
                    require_complete();
                    return value{mjs::string{h, res}};
                } else {
                    res.push_back(ch);
                }
            }
        }
    }
    throw std::runtime_error("Invalid test spec value \"" + s + "\"");
}